

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.hpp
# Opt level: O2

reference __thiscall
MILBlob::Util::Span<const_int,_18446744073709551615UL>::At
          (Span<const_int,_18446744073709551615UL> *this,size_t index)

{
  range_error *this_00;
  
  if (index < (this->m_size).m_size) {
    return this->m_ptr + index;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"index out of bounds");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

reference At(size_t index) const
    {
        MILVerifyIsTrue(index < Size(), std::range_error, "index out of bounds");
        return m_ptr[index];
    }